

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

XMLSize_t __thiscall xercesc_4_0::ElemStack::addChild(ElemStack *this,QName *child,bool toParent)

{
  XMLSize_t XVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  NoSuchElementException *this_00;
  ulong uVar5;
  long lVar6;
  pointer_____offset_0x10___ *ppuVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  
  XVar1 = this->fStackTop;
  if (XVar1 == 0) {
    this_00 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              ((EmptyStackException *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,200,ElemStack_EmptyStack,this->fMemoryManager);
    ppuVar7 = &EmptyStackException::typeinfo;
  }
  else {
    if (!toParent || XVar1 != 1) {
      lVar2 = *(long *)((long)this->fStack +
                       ((ulong)(byte)~toParent << 3 | 0xfffffffffffffff0) + XVar1 * 8);
      lVar3 = *(long *)(lVar2 + 0x10);
      if (*(long *)(lVar2 + 0x18) == lVar3) {
        auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar9._0_8_ = lVar3;
        auVar9._12_4_ = 0x45300000;
        dVar10 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * 1.25;
        uVar5 = (ulong)dVar10;
        uVar8 = 0x20;
        if (lVar3 != 0) {
          uVar8 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
        }
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar8 * 8);
        lVar3 = *(long *)(lVar2 + 0x18);
        if (lVar3 != 0) {
          lVar6 = 0;
          do {
            *(undefined8 *)(CONCAT44(extraout_var,iVar4) + lVar6 * 8) =
                 *(undefined8 *)(*(long *)(lVar2 + 0x20) + lVar6 * 8);
            lVar6 = lVar6 + 1;
          } while (lVar3 != lVar6);
        }
        (*this->fMemoryManager->_vptr_MemoryManager[4])
                  (this->fMemoryManager,*(undefined8 *)(lVar2 + 0x20));
        *(long *)(lVar2 + 0x20) = CONCAT44(extraout_var,iVar4);
        *(ulong *)(lVar2 + 0x10) = uVar8;
      }
      XVar1 = *(XMLSize_t *)(lVar2 + 0x18);
      *(XMLSize_t *)(lVar2 + 0x18) = XVar1 + 1;
      *(QName **)(*(long *)(lVar2 + 0x20) + XVar1 * 8) = child;
      return XVar1;
    }
    this_00 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
    NoSuchElementException::NoSuchElementException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,0xcf,ElemStack_NoParentPushed,this->fMemoryManager);
    ppuVar7 = &NoSuchElementException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar7,XMLException::~XMLException);
}

Assistant:

XMLSize_t ElemStack::addChild(QName* const child, const bool toParent)
{
    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    //
    //  If they want to add to the parent, then we have to have at least two
    //  elements on the stack.
    //
    if (toParent && (fStackTop < 2))
        ThrowXMLwithMemMgr(NoSuchElementException, XMLExcepts::ElemStack_NoParentPushed, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = toParent
                        ? fStack[fStackTop - 2] : fStack[fStackTop - 1];

    // See if we need to expand this row's child array
    if (curRow->fChildCount == curRow->fChildCapacity)
    {
        // Increase the capacity by a quarter and allocate a new row
        const XMLSize_t newCapacity = curRow->fChildCapacity ?
                                      (XMLSize_t)(curRow->fChildCapacity * 1.25) :
                                      32;
        QName** newRow = (QName**) fMemoryManager->allocate
        (
            newCapacity * sizeof(QName*)
        );//new QName*[newCapacity];

        //
        //  Copy over the old contents. We don't have to initialize the new
        //  part because The current child count is used to know how much of
        //  it is valid.
        //
        //  Only both doing this if there is any current content, since
        //  this code also does the initial faulting in of the array when
        //  both the current capacity and child count are zero.
        //
        for (XMLSize_t index = 0; index < curRow->fChildCount; index++)
            newRow[index] = curRow->fChildren[index];

        // Clean up the old children and store the new info
        fMemoryManager->deallocate(curRow->fChildren);//delete [] curRow->fChildren;
        curRow->fChildren = newRow;
        curRow->fChildCapacity = newCapacity;
    }

    // Add this id to the end of the row's child id array and bump the count
    curRow->fChildren[curRow->fChildCount++] = child;

    // Return the level of the index we just filled (before the bump)
    return curRow->fChildCount - 1;
}